

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

string * __thiscall fasttext::Args::metricToString_abi_cxx11_(Args *this,metric_name mn)

{
  int in_EDX;
  string *in_RDI;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"f1score",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"labelf1score",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"Unknown metric name!",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return in_RDI;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::labelf1score:
      return "labelf1score";
  }
  return "Unknown metric name!"; // should never happen
}